

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvolutionFilter.cpp
# Opt level: O2

bool __thiscall
Rml::ConvolutionFilter::Initialise
          (ConvolutionFilter *this,Vector2i _kernel_radii,FilterOperation _operation)

{
  Vector2i VVar1;
  code *pcVar2;
  bool bVar3;
  pointer __p_00;
  int iVar4;
  pointer __p;
  ulong __n;
  __uniq_ptr_impl<float,_std::default_delete<float[]>_> local_38;
  
  if (((ulong)_kernel_radii & 0x8000000080000000) == 0) {
    VVar1 = (Vector2i)((long)_kernel_radii * 2 + 0x100000001);
    this->kernel_size = VVar1;
    iVar4 = VVar1.y * VVar1.x;
    __n = 0xffffffffffffffff;
    if (-1 < iVar4) {
      __n = (long)iVar4 * 4;
    }
    __p_00 = (pointer)operator_new__(__n);
    memset(__p_00,0,__n);
    local_38._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (tuple<float_*,_std::default_delete<float[]>_>)
         (_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)0x0;
    ::std::__uniq_ptr_impl<float,_std::default_delete<float[]>_>::reset
              ((__uniq_ptr_impl<float,_std::default_delete<float[]>_> *)&this->kernel,__p_00);
    ::std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
              ((unique_ptr<float[],_std::default_delete<float[]>_> *)&local_38);
    this->operation = _operation;
  }
  else {
    bVar3 = Assert("Invalid input parameters to convolution filter.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ConvolutionFilter.cpp"
                   ,0x31);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  return ((ulong)_kernel_radii & 0x8000000080000000) == 0;
}

Assistant:

bool ConvolutionFilter::Initialise(Vector2i _kernel_radii, FilterOperation _operation)
{
	if (_kernel_radii.x < 0 || _kernel_radii.y < 0)
	{
		RMLUI_ERRORMSG("Invalid input parameters to convolution filter.");
		return false;
	}

	kernel_size = _kernel_radii * 2 + Vector2i(1);

	kernel = UniquePtr<float[]>(new float[kernel_size.x * kernel_size.y]());

	operation = _operation;
	return true;
}